

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::LeafNode<int,int,16u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          LeafNode<int,_int,_16U,_true> **args,uint *args_1,uint *args_2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  pointer pEVar5;
  size_type sVar6;
  ulong uVar7;
  undefined8 uVar8;
  pointer pEVar9;
  pointer pEVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  pointer pEVar13;
  long lVar14;
  long lVar15;
  pointer __src;
  ulong uVar16;
  long lVar17;
  
  pEVar5 = this->data_;
  sVar6 = this->len;
  __src = pEVar5 + sVar6;
  if (sVar6 != this->cap) {
    uVar3 = *args_1;
    uVar4 = *args_2;
    __src->node = *args;
    __src->size = uVar3;
    __src->offset = uVar4;
    this->len = sVar6 + 1;
    return pEVar5 + sVar6;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar7 = this->cap;
  if (uVar16 < uVar7 * 2) {
    uVar16 = uVar7 * 2;
  }
  if (0x7ffffffffffffff - uVar7 < uVar7) {
    uVar16 = 0x7ffffffffffffff;
  }
  lVar17 = (long)__src - (long)this->data_;
  pEVar13 = (pointer)operator_new(uVar16 << 4);
  uVar3 = *args_1;
  uVar4 = *args_2;
  *(LeafNode<int,_int,_16U,_true> **)((long)pEVar13 + lVar17) = *args;
  *(uint *)((long)pEVar13 + lVar17 + 8) = uVar3;
  *(uint *)((long)pEVar13 + lVar17 + 0xc) = uVar4;
  pEVar5 = this->data_;
  lVar14 = this->len * 0x10;
  lVar15 = (long)pEVar5 + (lVar14 - (long)__src);
  pEVar9 = pEVar5;
  pEVar10 = pEVar13;
  if (lVar15 == 0) {
    if (this->len != 0) {
      lVar15 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pEVar5->node + lVar15);
        uVar8 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pEVar13->node + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        lVar15 = lVar15 + 0x10;
      } while (lVar14 != lVar15);
    }
  }
  else {
    for (; pEVar9 != __src; pEVar9 = pEVar9 + 1) {
      uVar11 = pEVar9->size;
      uVar12 = pEVar9->offset;
      pEVar10->node = pEVar9->node;
      pEVar10->size = uVar11;
      pEVar10->offset = uVar12;
      pEVar10 = pEVar10 + 1;
    }
    memcpy((void *)((long)pEVar13 + lVar17 + 0x10),__src,
           (lVar15 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (pEVar5 != (pointer)this->firstElement) {
    operator_delete(pEVar5);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pEVar13;
  return (reference)((long)pEVar13 + lVar17);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }